

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void list_free_nodes(list_t *list)

{
  list_node_t *plVar1;
  list_node_t *node_next;
  list_node_t *node;
  list_t *list_local;
  
  node_next = list->head;
  while (node_next != (list_node_t *)0x0) {
    plVar1 = node_next->next;
    free(node_next);
    node_next = plVar1;
  }
  list_init(list);
  return;
}

Assistant:

void
list_free_nodes(
    list_t* list)
{
    list_node_t* node;
    list_node_t* node_next;

    for (node = list->head; node; node = node_next) {
        node_next = node->next;
        free(node);
    }
    
    list_init(list);
}